

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O1

Aig_Man_t * Saig_ManCreateIndMiter2(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  void *__ptr;
  Aig_Man_t *p;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  Aig_Obj_t *p1;
  ulong uVar17;
  ulong uVar18;
  
  sVar4 = (long)pAig->vObjs->nSize * 3;
  __ptr = calloc(sVar4,8);
  p = Aig_ManStart((int)sVar4);
  pcVar2 = pAig->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p->pName = pcVar5;
  pcVar2 = pAig->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p->pSpec = pcVar5;
  pAVar6 = p->pConst1;
  iVar11 = pAig->pConst1->Id;
  lVar9 = 0;
  do {
    *(Aig_Obj_t **)((long)__ptr + lVar9 * 8 + (long)iVar11 * 0x18) = pAVar6;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  iVar11 = 0;
  do {
    if (pAig->nRegs < pAig->nObjs[2]) {
      lVar9 = 0;
      do {
        if (pAig->vCis->nSize <= lVar9) goto LAB_0061ec24;
        pvVar3 = pAig->vCis->pArray[lVar9];
        pAVar6 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)__ptr + ((long)*(int *)((long)pvVar3 + 0x24) * 3 + (long)iVar11) * 8)
             = pAVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (long)pAig->nObjs[2] - (long)pAig->nRegs);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  uVar12 = pAig->nObjs[2] - pAig->nRegs;
  pVVar7 = pAig->vCis;
  if ((int)uVar12 < pVVar7->nSize) {
    uVar17 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) {
LAB_0061ec24:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar7->pArray[uVar17];
      pAVar6 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar3 + 0x24) * 0x18) = pAVar6;
      uVar17 = uVar17 + 1;
      pVVar7 = pAig->vCis;
    } while ((int)uVar17 < pVVar7->nSize);
  }
  iVar11 = 0;
  do {
    pVVar7 = pAig->vObjs;
    lVar9 = (long)iVar11;
    if (0 < pVVar7->nSize) {
      lVar13 = 0;
      do {
        pvVar3 = pVVar7->pArray[lVar13];
        if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
          uVar17 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                     *(ulong *)((long)__ptr + ((long)*(int *)(uVar17 + 0x24) * 3 + lVar9) * 8));
          }
          uVar17 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                      *(ulong *)((long)__ptr + ((long)*(int *)(uVar17 + 0x24) * 3 + lVar9) * 8));
          }
          pAVar6 = Aig_And(p,pAVar6,pAVar10);
          *(Aig_Obj_t **)((long)__ptr + ((long)*(int *)((long)pvVar3 + 0x24) * 3 + lVar9) * 8) =
               pAVar6;
        }
        lVar13 = lVar13 + 1;
        pVVar7 = pAig->vObjs;
      } while (lVar13 < pVVar7->nSize);
    }
    iVar15 = pAig->nRegs;
    lVar13 = (long)iVar15;
    if (0 < lVar13) {
      pVVar7 = pAig->vCos;
      iVar1 = pAig->nObjs[3];
      uVar17 = (ulong)(uint)(iVar1 - iVar15);
      iVar15 = -iVar15;
      do {
        if (((((int)uVar17 < 0) || (pVVar7->nSize <= iVar1 + iVar15)) ||
            (uVar12 = pAig->nObjs[2] + iVar15, (int)uVar12 < 0)) ||
           (pAig->vCis->nSize <= (int)uVar12)) goto LAB_0061ec24;
        uVar16 = *(ulong *)((long)pVVar7->pArray[uVar17] + 8);
        uVar14 = uVar16 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = (ulong)((uint)uVar16 & 1) ^
                   *(ulong *)((long)__ptr + ((long)*(int *)(uVar14 + 0x24) * 3 + lVar9) * 8);
        }
        if (iVar11 != 2) {
          *(ulong *)((long)__ptr +
                    ((long)*(int *)((long)pAig->vCis->pArray[uVar12] + 0x24) * 3 + lVar9 + 1) * 8) =
               uVar16;
        }
        uVar17 = uVar17 + 1;
        iVar15 = iVar15 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    iVar11 = iVar11 + 1;
    if (iVar11 == 3) {
      if (0 < vCands->nSize) {
        lVar9 = 0;
        do {
          pvVar3 = vCands->pArray[lVar9];
          if (0 < *(int *)((long)pvVar3 + 4)) {
            lVar13 = 0;
            do {
              uVar17 = *(ulong *)(*(long *)((long)pvVar3 + 8) + lVar13 * 8);
              uVar18 = uVar17 & 0xfffffffffffffffe;
              lVar8 = (long)*(int *)(uVar18 + 0x24);
              uVar16 = *(ulong *)((long)__ptr + lVar8 * 0x18 + 8);
              uVar14 = (ulong)((uint)uVar17 & 1);
              pAVar10 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + lVar8 * 0x18) ^ uVar14);
              pAVar6 = Aig_And(p,pAVar10,(Aig_Obj_t *)(uVar14 ^ 1 ^ uVar16));
              Aig_ObjCreateCo(p,pAVar6);
              p1 = (Aig_Obj_t *)(uVar14 ^ uVar16);
              pAVar6 = Aig_And(p,pAVar10,p1);
              Aig_ObjCreateCo(p,pAVar6);
              uVar17 = *(ulong *)((long)__ptr + (long)*(int *)(uVar18 + 0x24) * 0x18 + 0x10);
              pAVar6 = Aig_And(p,pAVar10,p1);
              pAVar6 = Aig_And(p,pAVar6,(Aig_Obj_t *)(uVar14 ^ 1 ^ uVar17));
              Aig_ObjCreateCo(p,pAVar6);
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)((long)pvVar3 + 4));
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < vCands->nSize);
      }
      Aig_ManCleanup(p);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return p;
    }
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter2( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
  int nFrames = 3;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    
    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
	    {
	      Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
	      Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
	      Aig_ObjCreateCo( pFrames, pMiter );
	    
	    /* need to check p & Xp is satisfiable */
	    /* jlong -- begin */
          {
	      Aig_Obj_t * pMiter2 = Aig_And( pFrames, pFan0, Aig_Not(pFan1));
	      Aig_ObjCreateCo( pFrames, pMiter2 ); 
          }
        /* jlong -- end  */
	    }

	    {			/* jlong -- begin */
	      Aig_Obj_t * pNode2 = pObjMap[nFrames*Aig_ObjId(pObjR)+2];
	      Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan1  = Aig_NotCond( pNode1,  Aig_IsComplement(pObj) );
	      Aig_Obj_t * pFan2  = Aig_NotCond( pNode2, !Aig_IsComplement(pObj) );
	      Aig_Obj_t * pMiter = Aig_And( pFrames, Aig_And(pFrames, pFan0, pFan1 ), pFan2);
	      Aig_ObjCreateCo( pFrames, pMiter ); /* jlong -- end  */
	    }

        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}